

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O0

pair<const_void_*const_*,_bool> __thiscall
llvm::SmallPtrSetImplBase::insert_imp_big(SmallPtrSetImplBase *this,void *Ptr)

{
  void *pvVar1;
  size_type sVar2;
  void *pvVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  pair<const_void_**,_bool> pVar5;
  pair<const_void_*const_*,_bool> pVar6;
  uint local_8c;
  bool local_69;
  pair<const_void_**,_bool> local_68;
  void **local_58;
  undefined1 local_50;
  bool local_41;
  pair<const_void_**,_bool> local_40;
  void **local_30;
  void **Bucket;
  void *Ptr_local;
  SmallPtrSetImplBase *this_local;
  bool local_10;
  
  Bucket = (void **)Ptr;
  Ptr_local = this;
  sVar2 = size(this);
  if (sVar2 << 2 < this->CurArraySize * 3) {
    if (this->CurArraySize - this->NumNonEmpty < this->CurArraySize >> 3) {
      Grow(this,this->CurArraySize);
    }
  }
  else {
    if (this->CurArraySize < 0x40) {
      local_8c = 0x80;
    }
    else {
      local_8c = this->CurArraySize << 1;
    }
    Grow(this,local_8c);
  }
  local_30 = FindBucketFor(this,Bucket);
  if ((void **)*local_30 == Bucket) {
    local_41 = false;
    pVar5 = std::make_pair<void_const**&,bool>(&local_30,&local_41);
    local_58 = pVar5.first;
    local_50 = pVar5.second;
    local_40.first = local_58;
    local_40.second = (bool)local_50;
    std::pair<const_void_*const_*,_bool>::pair<const_void_**,_bool,_true>
              ((pair<const_void_*const_*,_bool> *)&this_local,&local_40);
    uVar4 = extraout_RDX;
  }
  else {
    pvVar1 = *local_30;
    pvVar3 = getTombstoneMarker();
    if (pvVar1 == pvVar3) {
      this->NumTombstones = this->NumTombstones - 1;
    }
    else {
      this->NumNonEmpty = this->NumNonEmpty + 1;
    }
    *local_30 = Bucket;
    DebugEpochBase::incrementEpoch((DebugEpochBase *)this);
    local_69 = true;
    pVar5 = std::make_pair<void_const**&,bool>(&local_30,&local_69);
    local_68.first = pVar5.first;
    local_68.second = pVar5.second;
    std::pair<const_void_*const_*,_bool>::pair<const_void_**,_bool,_true>
              ((pair<const_void_*const_*,_bool> *)&this_local,&local_68);
    uVar4 = extraout_RDX_00;
  }
  pVar6._9_7_ = (undefined7)((ulong)uVar4 >> 8);
  pVar6.second = local_10;
  pVar6.first = &this_local->SmallArray;
  return pVar6;
}

Assistant:

std::pair<const void *const *, bool>
SmallPtrSetImplBase::insert_imp_big(const void *Ptr) {
  if (LLVM_UNLIKELY(size() * 4 >= CurArraySize * 3)) {
    // If more than 3/4 of the array is full, grow.
    Grow(CurArraySize < 64 ? 128 : CurArraySize * 2);
  } else if (LLVM_UNLIKELY(CurArraySize - NumNonEmpty < CurArraySize / 8)) {
    // If fewer of 1/8 of the array is empty (meaning that many are filled with
    // tombstones), rehash.
    Grow(CurArraySize);
  }

  // Okay, we know we have space.  Find a hash bucket.
  const void **Bucket = const_cast<const void**>(FindBucketFor(Ptr));
  if (*Bucket == Ptr)
    return std::make_pair(Bucket, false); // Already inserted, good.

  // Otherwise, insert it!
  if (*Bucket == getTombstoneMarker())
    --NumTombstones;
  else
    ++NumNonEmpty; // Track density.
  *Bucket = Ptr;
  incrementEpoch();
  return std::make_pair(Bucket, true);
}